

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexer.cxx
# Opt level: O3

void cmCTestResourceGroups_yy_delete_buffer(YY_BUFFER_STATE b,yyscan_t yyscanner)

{
  long lVar1;
  YY_BUFFER_STATE pyVar2;
  yyguts_t *yyg;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    lVar1 = *(long *)((long)yyscanner + 0x28);
    if (lVar1 == 0) {
      pyVar2 = (YY_BUFFER_STATE)0x0;
    }
    else {
      pyVar2 = *(YY_BUFFER_STATE *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8);
    }
    if (pyVar2 == b) {
      *(undefined8 *)(lVar1 + *(long *)((long)yyscanner + 0x18) * 8) = 0;
    }
    if (b->yy_is_our_buffer != 0) {
      free(b->yy_ch_buf);
    }
    free(b);
    return;
  }
  return;
}

Assistant:

void yy_delete_buffer (YY_BUFFER_STATE  b , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf , yyscanner );

	yyfree( (void *) b , yyscanner );
}